

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.pb.cc
# Opt level: O0

void __thiscall proto2_unittest::TestHugeFieldNumbers::clear_oneof_field(TestHugeFieldNumbers *this)

{
  TestAllTypes *this_00;
  OneofFieldCase OVar1;
  Arena *pAVar2;
  TestHugeFieldNumbers *this_local;
  
  OVar1 = oneof_field_case(this);
  if ((OVar1 != ONEOF_FIELD_NOT_SET) && (OVar1 != kOneofUint32)) {
    if (OVar1 == kOneofTestAllTypes) {
      pAVar2 = google::protobuf::MessageLite::GetArena((MessageLite *)this);
      if (pAVar2 == (Arena *)0x0) {
        this_00 = *(TestAllTypes **)((long)&this->field_0 + 0xa8);
        if (this_00 != (TestAllTypes *)0x0) {
          proto2_unittest::TestAllTypes::~TestAllTypes(this_00);
          operator_delete(this_00,0x340);
        }
      }
      else {
        google::protobuf::internal::MaybePoisonAfterClear
                  (&((this->field_0)._impl_.oneof_field_.oneof_test_all_types_)->super_Message);
      }
    }
    else if (OVar1 == kOneofString) {
      google::protobuf::internal::ArenaStringPtr::Destroy
                (&(this->field_0)._impl_.oneof_field_.oneof_string_);
    }
    else if (OVar1 == kOneofBytes) {
      google::protobuf::internal::ArenaStringPtr::Destroy
                (&(this->field_0)._impl_.oneof_field_.oneof_string_);
    }
  }
  (this->field_0)._impl_._oneof_case_[0] = 0;
  return;
}

Assistant:

void TestHugeFieldNumbers::clear_oneof_field() {
// @@protoc_insertion_point(one_of_clear_start:proto2_unittest.TestHugeFieldNumbers)
  ::google::protobuf::internal::TSanWrite(&_impl_);
  switch (oneof_field_case()) {
    case kOneofUint32: {
      // No need to clear
      break;
    }
    case kOneofTestAllTypes: {
      if (GetArena() == nullptr) {
        delete _impl_.oneof_field_.oneof_test_all_types_;
      } else if (::google::protobuf::internal::DebugHardenClearOneofMessageOnArena()) {
        ::google::protobuf::internal::MaybePoisonAfterClear(_impl_.oneof_field_.oneof_test_all_types_);
      }
      break;
    }
    case kOneofString: {
      _impl_.oneof_field_.oneof_string_.Destroy();
      break;
    }
    case kOneofBytes: {
      _impl_.oneof_field_.oneof_bytes_.Destroy();
      break;
    }
    case ONEOF_FIELD_NOT_SET: {
      break;
    }
  }
  _impl_._oneof_case_[0] = ONEOF_FIELD_NOT_SET;
}